

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

Var __thiscall Js::InterpreterStackFrame::NewScopeObject(InterpreterStackFrame *this)

{
  uint index;
  PropertyIdArray *propIds;
  JavascriptFunction *pJVar1;
  Type *literalType;
  Var pvVar2;
  
  if ((*(FunctionBody **)(this + 0x88))->hasCachedScopePropIds == true) {
    propIds = FunctionBody::GetFormalsPropIdArray(*(FunctionBody **)(this + 0x88),true);
    pJVar1 = (JavascriptFunction *)(**(code **)(**(long **)(this + 0x80) + 0x3d0))();
    pJVar1 = StackScriptFunction::GetCurrentFunctionObject(pJVar1);
    index = ActivationObjectEx::GetLiteralObjectRef(propIds);
    literalType = FunctionBody::GetObjectLiteralTypeRef(*(FunctionBody **)(this + 0x88),index);
    pvVar2 = JavascriptOperators::OP_InitCachedScope
                       (pJVar1,propIds,literalType,propIds->hasNonSimpleParams,
                        *(ScriptContext **)(this + 0x78));
  }
  else {
    pvVar2 = JavascriptOperators::OP_NewScopeObject(*(ScriptContext **)(this + 0x78));
  }
  *(Var *)(this + 0x58) = pvVar2;
  return pvVar2;
}

Assistant:

Var
        InterpreterStackFrame::NewScopeObject()
    {
        Var scopeObject;

        if (m_functionBody->HasCachedScopePropIds())
        {
            const Js::PropertyIdArray *propIds = this->m_functionBody->GetFormalsPropIdArray();

            JavascriptFunction* funcExpr = this->GetFunctionExpression();
            PropertyId objectId = ActivationObjectEx::GetLiteralObjectRef(propIds);
            scopeObject = JavascriptOperators::OP_InitCachedScope(funcExpr, propIds,
                this->GetFunctionBody()->GetObjectLiteralTypeRef(objectId),
                propIds->hasNonSimpleParams, GetScriptContext());

        }
        else
        {
            scopeObject = JavascriptOperators::OP_NewScopeObject(GetScriptContext());
        }
        this->SetLocalClosure(scopeObject);
        return scopeObject;
    }